

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QGraphicsEffect::updateBoundingRect(QGraphicsEffect *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = *(long *)(lVar1 + 0x78);
  if (lVar2 != 0) {
    (**(code **)(**(long **)(lVar2 + 8) + 0x70))();
    lVar1 = *(long *)(*(long *)(lVar1 + 0x78) + 8);
    if (*(int *)(lVar1 + 0x7c) == 2) {
      QPixmapCache::remove((Key *)(lVar1 + 0x88));
      return;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }